

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_sample.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DuckDBTableSampleBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  pointer pLVar1;
  reference this_00;
  TableCatalogEntry *this_01;
  ColumnDefinition *this_02;
  NotImplementedException *this_03;
  vector<duckdb::LogicalType,_true> *__range1;
  LogicalIndex idx;
  LogicalType *type;
  pointer __x;
  vector<duckdb::LogicalType,_true> types;
  string local_b0;
  QualifiedName qname;
  
  this_00 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
  Value::GetValue<std::__cxx11::string>(&local_b0,this_00);
  QualifiedName::Parse(&qname,&local_b0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  Binder::BindSchemaOrCatalog(context,&qname.catalog,&qname.schema);
  this_01 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                      (context,&qname.catalog,&qname.schema,&qname.name,
                       (QueryErrorContext)0xffffffffffffffff);
  if ((this_01->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.type == TABLE_ENTRY) {
    TableCatalogEntry::GetTypes(&types,this_01);
    pLVar1 = types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__x = types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start; __x != pLVar1; __x = __x + 1) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&return_types->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
    }
    for (idx.index = 0;
        idx.index <
        (ulong)(((long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       .
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x18); idx.index = idx.index + 1)
    {
      this_02 = TableCatalogEntry::GetColumn(this_01,idx);
      ColumnDefinition::GetName_abi_cxx11_(&local_b0,this_02);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
                 &local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
    }
    make_uniq<duckdb::DuckDBTableSampleFunctionData,duckdb::TableCatalogEntry&>
              ((duckdb *)&local_b0,this_01);
    *(pointer *)this = local_b0._M_dataplus._M_p;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    QualifiedName::~QualifiedName(&qname);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_b0,"Invalid Catalog type passed to table_sample()",(allocator *)&types
            );
  NotImplementedException::NotImplementedException(this_03,&local_b0);
  __cxa_throw(this_03,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> DuckDBTableSampleBind(ClientContext &context, TableFunctionBindInput &input,
                                                      vector<LogicalType> &return_types, vector<string> &names) {

	// look up the table name in the catalog
	auto qname = QualifiedName::Parse(input.inputs[0].GetValue<string>());
	Binder::BindSchemaOrCatalog(context, qname.catalog, qname.schema);

	auto &entry = Catalog::GetEntry<TableCatalogEntry>(context, qname.catalog, qname.schema, qname.name);
	if (entry.type != CatalogType::TABLE_ENTRY) {
		throw NotImplementedException("Invalid Catalog type passed to table_sample()");
	}
	auto &table_entry = entry.Cast<TableCatalogEntry>();
	auto types = table_entry.GetTypes();
	for (auto &type : types) {
		return_types.push_back(type);
	}
	for (idx_t i = 0; i < types.size(); i++) {
		auto logical_index = LogicalIndex(i);
		auto &col = table_entry.GetColumn(logical_index);
		names.push_back(col.GetName());
	}

	return make_uniq<DuckDBTableSampleFunctionData>(entry);
}